

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

int __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveHyper(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *feastol)

{
  undefined4 uVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  undefined4 uVar5;
  int32_t iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  pointer pnVar13;
  uint *puVar14;
  pointer pnVar15;
  devexpr *pdVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_55c;
  undefined1 local_538 [32];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [13];
  undefined3 uStack_4cb;
  int iStack_4c8;
  bool bStack_4c4;
  undefined8 local_4c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b8;
  cpp_dec_float<200U,_int,_void> local_4b0;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  devexpr local_330 [112];
  int local_2c0;
  undefined1 local_2bc;
  fpclass_type local_2b8;
  int32_t local_2b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar21 = 0;
  local_4d8 = SUB1613((undefined1  [16])0x0,0);
  local_4e8 = (undefined1  [16])0x0;
  local_4f8 = (undefined1  [16])0x0;
  local_508 = (undefined1  [16])0x0;
  local_518 = (undefined1  [16])0x0;
  local_538._16_16_ = (undefined1  [16])0x0;
  local_538._0_16_ = (undefined1  [16])0x0;
  uStack_4cb = 0;
  iStack_4c8 = 0;
  bStack_4c4 = false;
  local_4c0._4_4_ = 0x1c;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_430,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_3b0,-1,(type *)0x0);
  lVar19 = (long)(this->bestPrices).super_IdxSet.num;
  if (lVar19 < 1) {
    local_55c = -1;
  }
  else {
    uVar20 = lVar19 + 1;
    local_55c = -1;
    do {
      piVar9 = (this->bestPrices).super_IdxSet.idx;
      iVar8 = piVar9[uVar20 - 2];
      pnVar13 = pnVar3 + iVar8;
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_538;
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
      }
      iStack_4c8 = pnVar3[iVar8].m_backend.exp;
      bStack_4c4 = pnVar3[iVar8].m_backend.neg;
      local_4c0._0_4_ = pnVar3[iVar8].m_backend.fpclass;
      local_4c0._4_4_ = pnVar3[iVar8].m_backend.prec_elem;
      pnVar11 = feastol;
      pcVar12 = &local_4b0;
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
      }
      local_4b0.exp = (feastol->m_backend).exp;
      local_4b0.neg = (feastol->m_backend).neg;
      uVar1 = (feastol->m_backend).fpclass;
      uVar5 = (feastol->m_backend).prec_elem;
      local_4b0.fpclass = uVar1;
      local_4b0.prec_elem = uVar5;
      if (local_4b0.data._M_elems[0] != 0 || uVar1 != 0) {
        local_4b0.neg = (bool)(local_4b0.neg ^ 1);
      }
      if ((fpclass_type)local_4c0 == cpp_dec_float_NaN || uVar1 == 2) {
LAB_0059d980:
        iVar7 = (this->bestPrices).super_IdxSet.num;
        (this->bestPrices).super_IdxSet.num = iVar7 + -1;
        piVar9[uVar20 - 2] = piVar9[(long)iVar7 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasible).data[iVar8] = 0;
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_538,&local_4b0);
        if (-1 < iVar7) {
          piVar9 = (this->bestPrices).super_IdxSet.idx;
          goto LAB_0059d980;
        }
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_538;
        pdVar16 = local_b0;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          *(uint *)pdVar16 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
          pdVar16 = pdVar16 + (ulong)bVar21 * -8 + 4;
        }
        local_40 = iStack_4c8;
        local_3c = bStack_4c4;
        local_38 = (fpclass_type)local_4c0;
        iStack_34 = local_4c0._4_4_;
        pnVar13 = pnVar4 + iVar8;
        pnVar15 = pnVar13;
        pnVar11 = &local_130;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = pnVar4[iVar8].m_backend.exp;
        local_130.m_backend.neg = pnVar4[iVar8].m_backend.neg;
        local_130.m_backend.fpclass = pnVar4[iVar8].m_backend.fpclass;
        local_130.m_backend.prec_elem = pnVar4[iVar8].m_backend.prec_elem;
        pnVar11 = feastol;
        pnVar17 = &local_1b0;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (feastol->m_backend).exp;
        local_1b0.m_backend.neg = (feastol->m_backend).neg;
        local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4b0,local_b0,&local_130,&local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_b0);
        pcVar12 = &local_4b0;
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_538;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
        }
        iStack_4c8 = local_4b0.exp;
        bStack_4c4 = local_4b0.neg;
        local_4c0._0_4_ = local_4b0.fpclass;
        local_4c0._4_4_ = local_4b0.prec_elem;
        uVar10 = local_4b0._120_8_;
        if ((local_4b0.fpclass != 2) && (local_430.fpclass != cpp_dec_float_NaN)) {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_538,&local_430);
          uVar10 = local_4c0 & 0xffffffff;
          if (0 < iVar7) {
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_538;
            pcVar18 = &local_430;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pcVar18->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar21 * -8 + 4);
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
            }
            local_430.exp = iStack_4c8;
            local_430.neg = bStack_4c4;
            local_430.fpclass = (fpclass_type)local_4c0;
            local_430.prec_elem = local_4c0._4_4_;
            pnVar15 = pnVar13;
            pnVar11 = &this->last;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pnVar11->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar11 + (ulong)bVar21 * -8 + 4);
            }
            (this->last).m_backend.exp = (pnVar13->m_backend).exp;
            (this->last).m_backend.neg = (pnVar13->m_backend).neg;
            iVar6 = (pnVar13->m_backend).prec_elem;
            (this->last).m_backend.fpclass = (pnVar13->m_backend).fpclass;
            (this->last).m_backend.prec_elem = iVar6;
            local_55c = iVar8;
          }
        }
        if (local_3b0.fpclass == cpp_dec_float_NaN || (int)uVar10 == 2) {
LAB_0059dbce:
          if (local_3b0.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_4b0,0,(type *)0x0);
            iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3b0,&local_4b0);
            if (iVar8 < 0) goto LAB_0059dc05;
          }
        }
        else {
          iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_538,&local_3b0);
          if (-1 < iVar8) {
            goto LAB_0059dbce;
          }
LAB_0059dc05:
          puVar14 = (uint *)local_538;
          pcVar12 = &local_3b0;
          for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar14;
            puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_3b0.exp = iStack_4c8;
          local_3b0.neg = bStack_4c4;
          local_3b0.fpclass = (fpclass_type)local_4c0;
          local_3b0.prec_elem = local_4c0._4_4_;
        }
      }
      uVar20 = uVar20 - 1;
    } while (1 < uVar20);
  }
  lVar19 = (long)(((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->updateViols).super_IdxSet.num;
  if (0 < lVar19) {
    local_4b8 = &this->last;
    uVar20 = lVar19 + 1;
    do {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar8 = (pSVar2->updateViols).super_IdxSet.idx[uVar20 - 2];
      if ((pSVar2->isInfeasible).data[iVar8] == 1) {
        pnVar13 = pnVar3 + iVar8;
        puVar14 = (uint *)local_538;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          *puVar14 = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
          puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
        }
        iStack_4c8 = pnVar3[iVar8].m_backend.exp;
        bStack_4c4 = pnVar3[iVar8].m_backend.neg;
        local_4c0._0_4_ = pnVar3[iVar8].m_backend.fpclass;
        local_4c0._4_4_ = pnVar3[iVar8].m_backend.prec_elem;
        puVar14 = (uint *)local_538;
        pdVar16 = local_330;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          *(uint *)pdVar16 = *puVar14;
          puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
          pdVar16 = pdVar16 + (ulong)bVar21 * -8 + 4;
        }
        pnVar13 = pnVar4 + iVar8;
        pnVar15 = pnVar13;
        pnVar11 = &local_230;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_230.m_backend.exp = pnVar4[iVar8].m_backend.exp;
        local_230.m_backend.neg = pnVar4[iVar8].m_backend.neg;
        local_230.m_backend.fpclass = pnVar4[iVar8].m_backend.fpclass;
        local_230.m_backend.prec_elem = pnVar4[iVar8].m_backend.prec_elem;
        pnVar11 = feastol;
        pnVar17 = &local_2b0;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_2b0.m_backend.exp = (feastol->m_backend).exp;
        local_2b0.m_backend.neg = (feastol->m_backend).neg;
        local_2b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_2b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        local_2c0 = iStack_4c8;
        local_2bc = bStack_4c4;
        local_2b8 = (fpclass_type)local_4c0;
        local_2b4 = local_4c0._4_4_;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4b0,local_330,&local_230,&local_2b0,&local_2b0);
        pcVar12 = &local_4b0;
        puVar14 = (uint *)local_538;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          *puVar14 = (((cpp_dec_float<200U,_int,_void> *)&pcVar12->data)->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar21 * -2 + 1) * 4)
          ;
          puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
        }
        iStack_4c8 = local_4b0.exp;
        bStack_4c4 = local_4b0.neg;
        local_4c0._0_4_ = local_4b0.fpclass;
        local_4c0._4_4_ = local_4b0.prec_elem;
        if (((local_4b0.fpclass != 2) && (local_3b0.fpclass != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_538,&local_3b0), 0 < iVar7))
        {
          if ((((fpclass_type)local_4c0 != cpp_dec_float_NaN) &&
              (local_430.fpclass != cpp_dec_float_NaN)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_538,&local_430), 0 < iVar7)
             ) {
            puVar14 = (uint *)local_538;
            pcVar12 = &local_430;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar14;
              puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar12 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_430.exp = iStack_4c8;
            local_430.neg = bStack_4c4;
            local_430.fpclass = (fpclass_type)local_4c0;
            local_430.prec_elem = local_4c0._4_4_;
            pnVar15 = pnVar13;
            pnVar11 = local_4b8;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pnVar11->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar11 + (ulong)bVar21 * -8 + 4);
            }
            (this->last).m_backend.exp = (pnVar13->m_backend).exp;
            (this->last).m_backend.neg = (pnVar13->m_backend).neg;
            iVar6 = (pnVar13->m_backend).prec_elem;
            (this->last).m_backend.fpclass = (pnVar13->m_backend).fpclass;
            (this->last).m_backend.prec_elem = iVar6;
            local_55c = iVar8;
          }
          (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->isInfeasible).data[iVar8] = 2;
          DIdxSet::addIdx(&this->bestPrices,iVar8);
        }
      }
      uVar20 = uVar20 - 1;
    } while (1 < uVar20);
  }
  return local_55c;
}

Assistant:

int SPxDevexPR<R>::selectLeaveHyper(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   R leastBest = -1;
   int bstI = -1;
   int idx = -1;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -feastol);
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bstI = idx;
               last = cpen[idx];
            }

            // put index into candidate list
            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bstI;
}